

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_tests.cpp
# Opt level: O3

void __thiscall random_tests::randbits_test::test_method(randbits_test *this)

{
  long *plVar1;
  long *plVar2;
  undefined8 uVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  void *__s;
  uint64_t uVar7;
  long lVar8;
  int bits;
  ulong uVar9;
  long lVar10;
  iterator in_R8;
  iterator pvVar11;
  iterator in_R9;
  int iVar12;
  int iVar13;
  long in_FS_OFFSET;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  const_string file;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  int local_2ec;
  undefined4 local_2c4;
  ulong local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  lazy_ostream local_298;
  undefined1 *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  uint64_t gen2;
  uint64_t gen;
  uint64_t *local_248;
  undefined **local_240;
  undefined1 local_238;
  undefined1 *local_230;
  uint64_t **local_228;
  uint64_t *local_220;
  undefined **local_218;
  undefined1 local_210;
  undefined1 *local_208;
  uint64_t **local_200;
  char *local_1f8;
  char *local_1f0;
  assertion_result local_1e8;
  FastRandomContext ctx_test2;
  FastRandomContext ctx_test1;
  FastRandomContext ctx_lens;
  
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  FastRandomContext::FastRandomContext(&ctx_lens,false);
  FastRandomContext::FastRandomContext(&ctx_test1,true);
  FastRandomContext::FastRandomContext(&ctx_test2,true);
  iVar13 = 0;
  local_2ec = 0;
  do {
    __s = operator_new(0x208000);
    iVar12 = 0;
    memset(__s,0,0x208000);
LAB_0052c92a:
    do {
      do {
        uVar7 = FastRandomContext::rand64(&ctx_lens);
        uVar9 = uVar7 % 0x41;
        bits = (int)uVar9;
        gen = RandomMixin<FastRandomContext>::randbits
                        (&ctx_test1.super_RandomMixin<FastRandomContext>,bits);
        if (uVar9 < 0x20) {
          if (uVar9 == 0) {
            if (ctx_test2.super_RandomMixin<FastRandomContext>.bitbuf_size < 0) {
              uVar7 = FastRandomContext::rand64(&ctx_test2);
              ctx_test2.super_RandomMixin<FastRandomContext>.bitbuf =
                   uVar7 >> (-(char)ctx_test2.super_RandomMixin<FastRandomContext>.bitbuf_size &
                            0x3fU);
              ctx_test2.super_RandomMixin<FastRandomContext>.bitbuf_size =
                   ctx_test2.super_RandomMixin<FastRandomContext>.bitbuf_size + 0x40;
            }
            gen2 = 0;
          }
          else if (uVar9 == 1) {
            gen2 = RandomMixin<FastRandomContext>::randbits<1>
                             (&ctx_test2.super_RandomMixin<FastRandomContext>);
          }
          else if (uVar9 == 7) {
            gen2 = RandomMixin<FastRandomContext>::randbits<7>
                             (&ctx_test2.super_RandomMixin<FastRandomContext>);
          }
          else {
LAB_0052ca21:
            gen2 = RandomMixin<FastRandomContext>::randbits
                             (&ctx_test2.super_RandomMixin<FastRandomContext>,bits);
          }
        }
        else if (uVar9 == 0x20) {
          gen2 = RandomMixin<FastRandomContext>::randbits<32>
                           (&ctx_test2.super_RandomMixin<FastRandomContext>);
        }
        else if (uVar9 == 0x33) {
          gen2 = RandomMixin<FastRandomContext>::randbits<51>
                           (&ctx_test2.super_RandomMixin<FastRandomContext>);
        }
        else {
          if (uVar9 != 0x40) goto LAB_0052ca21;
          gen2 = FastRandomContext::rand64(&ctx_test2);
        }
        local_268 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
        ;
        local_260 = "";
        local_278 = &boost::unit_test::basic_cstring<char_const>::null;
        local_270 = &boost::unit_test::basic_cstring<char_const>::null;
        file.m_end = (iterator)0xa7;
        file.m_begin = (iterator)&local_268;
        msg.m_end = in_R9;
        msg.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_278,
                   msg);
        local_298.m_empty = false;
        local_298._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
        local_288 = boost::unit_test::lazy_ostream::inst;
        local_280 = "";
        local_1e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(gen == gen2);
        local_1e8.m_message.px = (element_type *)0x0;
        local_1e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_1f8 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
        ;
        local_1f0 = "";
        local_220 = &gen;
        local_210 = 0;
        local_218 = &PTR__lazy_ostream_013ae0c8;
        local_208 = boost::unit_test::lazy_ostream::inst;
        local_200 = &local_220;
        local_248 = &gen2;
        local_238 = 0;
        local_240 = &PTR__lazy_ostream_013ae0c8;
        local_230 = boost::unit_test::lazy_ostream::inst;
        local_228 = &local_248;
        pvVar11 = (iterator)0x1;
        in_R9 = (iterator)0x2;
        boost::test_tools::tt_detail::report_assertion
                  (&local_1e8,&local_298,1,2,REQUIRE,0xe9fc3c,(size_t)&local_1f8,0xa7,&local_218,
                   "gen2",&local_240);
        boost::detail::shared_count::~shared_count(&local_1e8.m_message.pn);
        if (uVar9 < 0x40) {
          local_2a8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
          ;
          local_2a0 = "";
          local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
          local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
          file_00.m_end = (iterator)0xa9;
          file_00.m_begin = (iterator)&local_2a8;
          msg_00.m_end = in_R9;
          msg_00.m_begin = pvVar11;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
                     (size_t)&local_2b8,msg_00);
          local_2c0 = gen >> ((byte)uVar9 & 0x3f);
          local_1e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(local_2c0 == 0);
          local_298.m_empty = false;
          local_298._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
          local_288 = boost::unit_test::lazy_ostream::inst;
          local_280 = "";
          local_2c4 = 0;
          local_1e8.m_message.px = (element_type *)0x0;
          local_1e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_1f8 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
          ;
          local_1f0 = "";
          local_220 = &local_2c0;
          local_210 = 0;
          local_218 = &PTR__lazy_ostream_013ae0c8;
          local_208 = boost::unit_test::lazy_ostream::inst;
          local_200 = &local_220;
          local_248 = (uint64_t *)&local_2c4;
          local_238 = 0;
          local_240 = &PTR__lazy_ostream_013ae248;
          local_230 = boost::unit_test::lazy_ostream::inst;
          local_228 = &local_248;
          in_R8 = (iterator)0x1;
          in_R9 = (iterator)0x2;
          boost::test_tools::tt_detail::report_assertion
                    (&local_1e8,&local_298,1,2,REQUIRE,0xec2c28,(size_t)&local_1f8,0xa9,&local_218,
                     "0",&local_240);
          boost::detail::shared_count::~shared_count(&local_1e8.m_message.pn);
          if (uVar9 != 0) goto LAB_0052cd9a;
        }
        else {
LAB_0052cd9a:
          uVar5 = (bits + -1) * bits;
          uVar9 = 0;
          do {
            lVar10 = (long)(iVar13 * 0x820 +
                            ((int)(short)((short)((uVar5 & 0xffff) >> 0xf) + (short)uVar5) >> 1) +
                           (int)uVar9) * 0x10;
            in_R8 = (iterator)(ulong)((gen >> (uVar9 & 0x3f) & 1) != 0);
            plVar1 = (long *)((long)__s + lVar10);
            lVar8 = plVar1[1];
            plVar2 = (long *)((long)__s + lVar10);
            *plVar2 = *plVar1 + 1;
            plVar2[1] = (long)(in_R8 + lVar8);
            uVar9 = uVar9 + 1;
          } while (bits + (uint)(bits == 0) != uVar9);
        }
        iVar6 = iVar13 + 0x40;
        if (bits <= iVar13) {
          iVar6 = iVar13;
        }
        iVar13 = iVar6 - bits;
        iVar12 = iVar12 + 1;
      } while (iVar12 != 1000);
      uVar9 = 0x8201;
      lVar8 = 0x30;
      while (0xf1 < *(ulong *)((long)__s + lVar8 + -0x30)) {
        if (((*(ulong *)((long)__s + lVar8 + -0x20) < 0xf2) ||
            (*(ulong *)((long)__s + lVar8 + -0x10) < 0xf2)) ||
           (*(ulong *)((long)__s + lVar8) < 0xf2)) {
          iVar12 = 0;
          goto LAB_0052c92a;
        }
        uVar9 = uVar9 - 1;
        lVar8 = lVar8 + 0x40;
        if (uVar9 < 2) goto LAB_0052ce86;
      }
      iVar12 = 0;
    } while (lVar8 != 0x208030);
LAB_0052ce86:
    lVar8 = 8;
    do {
      uVar3 = *(undefined8 *)((long)__s + lVar8 + -8);
      auVar16._0_8_ = (double)CONCAT44(0x43300000,(int)uVar3);
      auVar16._8_4_ = (int)((ulong)uVar3 >> 0x20);
      auVar16._12_4_ = 0x45300000;
      dVar14 = (auVar16._8_8_ - 1.9342813113834067e+25) + (auVar16._0_8_ - 4503599627370496.0);
      uVar3 = *(undefined8 *)((long)__s + lVar8);
      dVar15 = dVar14 * 0.25;
      if (dVar15 < 0.0) {
        dVar15 = sqrt(dVar15);
      }
      else {
        dVar15 = SQRT(dVar15);
      }
      auVar17._0_8_ = (double)CONCAT44(0x43300000,(int)uVar3);
      auVar17._8_4_ = (int)((ulong)uVar3 >> 0x20);
      auVar17._12_4_ = 0x45300000;
      if (dVar15 * 7.78 <=
          ABS(dVar14 * 0.5 -
              ((auVar17._8_8_ - 1.9342813113834067e+25) + (auVar17._0_8_ - 4503599627370496.0)))) {
        __assert_fail("fabs(val.first * 0.5 - val.second) < sqrt(val.first * 0.25) * 7.78",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/random_tests.cpp"
                      ,0xbd,"void random_tests::randbits_test::test_method()");
      }
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x208008);
    operator_delete(__s,0x208000);
    local_2ec = local_2ec + 1;
    if (local_2ec == 5) {
      ChaCha20::~ChaCha20(&ctx_test2.rng);
      ChaCha20::~ChaCha20(&ctx_test1.rng);
      ChaCha20::~ChaCha20(&ctx_lens.rng);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
        __stack_chk_fail();
      }
      return;
    }
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(randbits_test)
{
    FastRandomContext ctx_lens; //!< RNG for producing the lengths requested from ctx_test.
    FastRandomContext ctx_test1(true), ctx_test2(true); //!< The RNGs being tested.
    int ctx_test_bitsleft{0}; //!< (Assumed value of) ctx_test::bitbuf_len

    // Run the entire test 5 times.
    for (int i = 0; i < 5; ++i) {
        // count (first) how often it has occurred, and (second) how often it was true:
        // - for every bit position, in every requested bits count (0 + 1 + 2 + ... + 64 = 2080)
        // - for every value of ctx_test_bitsleft (0..63 = 64)
        std::vector<std::pair<uint64_t, uint64_t>> seen(2080 * 64);
        while (true) {
            // Loop 1000 times, just to not continuously check std::all_of.
            for (int j = 0; j < 1000; ++j) {
                // Decide on a number of bits to request (0 through 64, inclusive; don't use randbits/randrange).
                int bits = ctx_lens.rand64() % 65;
                // Generate that many bits.
                uint64_t gen = ctx_test1.randbits(bits);
                // For certain bits counts, also test randbits<Bits> and compare.
                uint64_t gen2;
                if (bits == 0) {
                    gen2 = ctx_test2.randbits<0>();
                } else if (bits == 1) {
                    gen2 = ctx_test2.randbits<1>();
                } else if (bits == 7) {
                    gen2 = ctx_test2.randbits<7>();
                } else if (bits == 32) {
                    gen2 = ctx_test2.randbits<32>();
                } else if (bits == 51) {
                    gen2 = ctx_test2.randbits<51>();
                } else if (bits == 64) {
                    gen2 = ctx_test2.randbits<64>();
                } else {
                    gen2 = ctx_test2.randbits(bits);
                }
                BOOST_CHECK_EQUAL(gen, gen2);
                // Make sure the result is in range.
                if (bits < 64) BOOST_CHECK_EQUAL(gen >> bits, 0);
                // Mark all the seen bits in the output.
                for (int bit = 0; bit < bits; ++bit) {
                    int idx = bit + (bits * (bits - 1)) / 2 + 2080 * ctx_test_bitsleft;
                    seen[idx].first += 1;
                    seen[idx].second += (gen >> bit) & 1;
                }
                // Update ctx_test_bitself.
                if (bits > ctx_test_bitsleft) {
                    ctx_test_bitsleft = ctx_test_bitsleft + 64 - bits;
                } else {
                    ctx_test_bitsleft -= bits;
                }
            }
            // Loop until every bit position/combination is seen 242 times.
            if (std::all_of(seen.begin(), seen.end(), [](const auto& x) { return x.first >= 242; })) break;
        }
        // Check that each bit appears within 7.78 standard deviations of 50%
        // (each will fail with P < 1/(2080 * 64 * 10^9)).
        for (const auto& val : seen) {
             assert(fabs(val.first * 0.5 - val.second) < sqrt(val.first * 0.25) * 7.78);
        }
    }
}